

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O1

bool Function_Template::form3_Threshold(ThresholdForm3 Threshold)

{
  byte bVar1;
  byte value;
  bool bVar2;
  uint uVar3;
  uint32_t roiHeight;
  uint32_t roiWidth;
  uint32_t roiY;
  uint32_t roiX;
  Image output;
  Image input;
  uint32_t local_80;
  uint32_t local_7c;
  uint32_t local_78;
  uint32_t local_74;
  ImageTemplate<unsigned_char> local_70;
  Image local_48;
  
  value = Unit_Test::intensityValue();
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&local_70,0,0,'\x01','\x01');
  Test_Helper::uniformImage(&local_48,value,0,0,&local_70);
  local_70._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00219948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_70);
  Unit_Test::generateRoi(&local_48,&local_74,&local_78,&local_7c,&local_80);
  uVar3 = rand();
  bVar1 = (char)(uVar3 / 0xff) + (char)uVar3;
  (*Threshold)(&local_70,&local_48,local_74,local_78,local_7c,local_80,bVar1);
  bVar2 = Unit_Test::equalSize(&local_70,local_7c,local_80);
  if (bVar2) {
    bVar2 = Unit_Test::verifyImage(&local_70,(value < bVar1) + 0xff);
  }
  else {
    bVar2 = false;
  }
  local_70._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00219948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_70);
  local_48._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00219948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_48);
  return bVar2;
}

Assistant:

bool form3_Threshold(ThresholdForm3 Threshold)
    {
        const uint8_t intensity = intensityValue();
        const PenguinV_Image::Image input = uniformImage( intensity );

        uint32_t roiX, roiY, roiWidth, roiHeight;
        generateRoi( input, roiX, roiY, roiWidth, roiHeight );

        const uint8_t threshold = randomValue <uint8_t>( 255 );

        const PenguinV_Image::Image output = Threshold( input, roiX, roiY, roiWidth, roiHeight, threshold );

        return equalSize( output, roiWidth, roiHeight ) && verifyImage( output, intensity < threshold ? 0 : 255 );
    }